

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h263d_parser.c
# Opt level: O0

MPP_RET mpp_h263_parser_reset(H263dParser ctx)

{
  int index_00;
  MppBufSlots slots_00;
  RK_S32 index;
  H263Hdr *hdr_ref0;
  H263Hdr *hdr_curr;
  MppBufSlots slots;
  H263dParserImpl *p;
  H263dParser ctx_local;
  
  slots_00 = *ctx;
  index_00 = *(int *)((long)ctx + 0x88);
  if ((h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"in\n","mpp_h263_parser_reset");
  }
  if (-1 < index_00) {
    mpp_buf_slot_clr_flag(slots_00,index_00,SLOT_CODEC_USE);
    *(undefined4 *)((long)ctx + 0x88) = 0xffffffff;
  }
  if (-1 < *(int *)((long)ctx + 0x88)) {
    mpp_buf_slot_clr_flag(slots_00,*(int *)((long)ctx + 0x88),SLOT_CODEC_USE);
    *(undefined4 *)((long)ctx + 0x88) = 0xffffffff;
  }
  *(undefined4 *)((long)ctx + 0xc) = 0;
  if ((h263d_debug & 1) != 0) {
    _mpp_log_l(4,(char *)0x0,"out\n","mpp_h263_parser_reset");
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_h263_parser_reset(H263dParser ctx)
{
    H263dParserImpl *p = (H263dParserImpl *)ctx;
    MppBufSlots slots = p->frame_slots;
    H263Hdr *hdr_curr = &p->hdr_ref0;
    H263Hdr *hdr_ref0 = &p->hdr_ref0;
    RK_S32 index = hdr_curr->slot_idx;

    h263d_dbg_func("in\n");

    if (index >= 0) {
        mpp_buf_slot_clr_flag(slots, index, SLOT_CODEC_USE);
        hdr_curr->slot_idx = -1;
    }

    index = hdr_ref0->slot_idx;
    if (index >= 0) {
        mpp_buf_slot_clr_flag(slots, index, SLOT_CODEC_USE);
        hdr_ref0->slot_idx = -1;
    }

    p->found_i_vop = 0;

    h263d_dbg_func("out\n");

    return MPP_OK;
}